

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageFormatTests.cpp
# Opt level: O0

bool deqp::egl::Image::isCompatibleCreateAndModifyActions(Action *create,Action *modify)

{
  bool bVar1;
  GLenum format;
  GLenum modifyFormat_00;
  GLenum modifyType_00;
  long local_90;
  long local_80;
  long local_70;
  ModifyTexSubImage *local_60;
  Create *local_50;
  GLenum modifyType;
  GLenum modifyFormat;
  ModifyTexSubImage *gles2TexSubImageModify;
  GLenum createFormat;
  Create *gles2Create;
  Action *modify_local;
  Action *create_local;
  
  if (create == (Action *)0x0) {
    local_50 = (Create *)0x0;
  }
  else {
    local_50 = (Create *)__dynamic_cast(create,&Action::typeinfo,&GLES2ImageApi::Create::typeinfo,0)
    ;
  }
  if (local_50 == (Create *)0x0) {
    create_local._7_1_ = false;
  }
  else {
    format = GLES2ImageApi::Create::getEffectiveFormat(local_50);
    if (modify == (Action *)0x0) {
      local_60 = (ModifyTexSubImage *)0x0;
    }
    else {
      local_60 = (ModifyTexSubImage *)
                 __dynamic_cast(modify,&Action::typeinfo,&GLES2ImageApi::ModifyTexSubImage::typeinfo
                                ,0);
    }
    if (local_60 == (ModifyTexSubImage *)0x0) {
      if (modify == (Action *)0x0) {
        local_70 = 0;
      }
      else {
        local_70 = __dynamic_cast(modify,&Action::typeinfo,
                                  &GLES2ImageApi::ModifyRenderbufferClearColor::typeinfo,0);
      }
      if ((local_70 == 0) ||
         ((bVar1 = isDepthFormat(format), !bVar1 && (bVar1 = isStencilFormat(format), !bVar1)))) {
        if (modify == (Action *)0x0) {
          local_80 = 0;
        }
        else {
          local_80 = __dynamic_cast(modify,&Action::typeinfo,
                                    &GLES2ImageApi::ModifyRenderbufferClearDepth::typeinfo,0);
        }
        if ((local_80 == 0) || (bVar1 = isDepthFormat(format), bVar1)) {
          if (modify == (Action *)0x0) {
            local_90 = 0;
          }
          else {
            local_90 = __dynamic_cast(modify,&Action::typeinfo,
                                      &GLES2ImageApi::ModifyRenderbufferClearStencil::typeinfo,0);
          }
          if ((local_90 == 0) || (bVar1 = isStencilFormat(format), bVar1)) {
            create_local._7_1_ = true;
          }
          else {
            create_local._7_1_ = false;
          }
        }
        else {
          create_local._7_1_ = false;
        }
      }
      else {
        create_local._7_1_ = false;
      }
    }
    else {
      modifyFormat_00 = GLES2ImageApi::ModifyTexSubImage::getFormat(local_60);
      modifyType_00 = GLES2ImageApi::ModifyTexSubImage::getType(local_60);
      create_local._7_1_ = isCompatibleFormats(format,modifyFormat_00,modifyType_00);
    }
  }
  return create_local._7_1_;
}

Assistant:

bool isCompatibleCreateAndModifyActions (const Action& create, const Action& modify)
{
	if (const GLES2ImageApi::Create* gles2Create = dynamic_cast<const GLES2ImageApi::Create*>(&create))
	{
		const GLenum createFormat = gles2Create->getEffectiveFormat();

		if (const GLES2ImageApi::ModifyTexSubImage* gles2TexSubImageModify = dynamic_cast<const GLES2ImageApi::ModifyTexSubImage*>(&modify))
		{
			const GLenum modifyFormat	= gles2TexSubImageModify->getFormat();
			const GLenum modifyType		= gles2TexSubImageModify->getType();

			return isCompatibleFormats(createFormat, modifyFormat, modifyType);
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearColor*>(&modify))
		{
			// reintepreting color as non-color is not meaningful
			if (isDepthFormat(createFormat) || isStencilFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearDepth*>(&modify))
		{
			// reintepreting depth as non-depth is not meaningful
			if (!isDepthFormat(createFormat))
				return false;
		}

		if (dynamic_cast<const GLES2ImageApi::ModifyRenderbufferClearStencil*>(&modify))
		{
			// reintepreting stencil as non-stencil is not meaningful
			if (!isStencilFormat(createFormat))
				return false;
		}

		return true;
	}
	else
		DE_ASSERT(false);

	return false;
}